

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> * __thiscall
pybind11::class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>>::
def_property_readonly<anurbs::Ref<anurbs::Brep>(anurbs::BrepLoop::*)()const>
          (class_<anurbs::BrepLoop,std::shared_ptr<anurbs::BrepLoop>> *this,char *name,
          offset_in_Model_to_subr *fget)

{
  class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> *pcVar1;
  return_value_policy local_21;
  cpp_function local_20;
  
  cpp_function::cpp_function<anurbs::Ref<anurbs::Brep>,anurbs::BrepLoop>(&local_20,*fget);
  local_21 = reference_internal;
  pcVar1 = class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_>::
           def_property_readonly<pybind11::return_value_policy>
                     ((class_<anurbs::BrepLoop,_std::shared_ptr<anurbs::BrepLoop>_> *)this,name,
                      &local_20,&local_21);
  pybind11::object::~object((object *)&local_20);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }